

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

HashErr lookup_symbol(SymbolTable *s,char *name,SymbolInfo *val,char **original_name_ptr)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Symbol *pSVar5;
  
  uVar2 = hash_code(name);
  cVar1 = *name;
  iVar4 = s->bucket[uVar2]->num_symbols;
  pSVar5 = s->bucket[uVar2]->symbol;
  while( true ) {
    if (iVar4 < 1) {
      return HASH_NOTFOUND;
    }
    if ((cVar1 == *pSVar5->name) && (iVar3 = strcmp(name,pSVar5->name), iVar3 == 0)) break;
    pSVar5 = pSVar5 + 1;
    iVar4 = iVar4 + -1;
  }
  if (val != (SymbolInfo *)0x0) {
    *val = pSVar5->value;
  }
  if (original_name_ptr == (char **)0x0) {
    return HASH_NOERR;
  }
  *original_name_ptr = pSVar5->name;
  return HASH_NOERR;
}

Assistant:

HashErr
lookup_symbol (const SymbolTable *s, const char *name, SymbolInfo *val,
	       const char **original_name_ptr)
{
  int i, bucket_num = hash_code (name);
  Bucket *b = s->bucket[bucket_num];
  Symbol *sym;
  char firstc = *name;

  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      {
	if (val != NULL)
	  *val = sym->value;
	if (original_name_ptr != NULL)
	  *original_name_ptr = sym->name;
	return HASH_NOERR;
      }

  return HASH_NOTFOUND;
}